

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void handle_D_option(char *z)

{
  char **ppcVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  char **paz;
  char *z_local;
  
  nDefine = nDefine + 1;
  azDefine = (char **)realloc(azDefine,(long)nDefine << 3);
  if (azDefine == (char **)0x0) {
    fprintf(_stderr,"out of memory\n");
    exit(1);
  }
  ppcVar1 = azDefine + (nDefine + -1);
  sVar2 = strlen(z);
  pcVar3 = (char *)malloc((long)((int)sVar2 + 1));
  *ppcVar1 = pcVar3;
  if (*ppcVar1 == (char *)0x0) {
    fprintf(_stderr,"out of memory\n");
    exit(1);
  }
  strcpy(*ppcVar1,z);
  paz = (char **)*ppcVar1;
  while( true ) {
    bVar4 = false;
    if (*(char *)paz != '\0') {
      bVar4 = *(char *)paz != '=';
    }
    if (!bVar4) break;
    paz = (char **)((long)paz + 1);
  }
  *(undefined1 *)paz = 0;
  return;
}

Assistant:

static void handle_D_option(char *z){
  char **paz;
  nDefine++;
  azDefine = (char **) realloc(azDefine, sizeof(azDefine[0])*nDefine);
  if( azDefine==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  paz = &azDefine[nDefine-1];
  *paz = (char *) malloc( lemonStrlen(z)+1 );
  if( *paz==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  strcpy(*paz, z);
  for(z=*paz; *z && *z!='='; z++){}
  *z = 0;
}